

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

UObject * __thiscall
icu_63::CalendarService::handleDefault
          (CalendarService *this,ICUServiceKey *key,UnicodeString *param_2,UErrorCode *status)

{
  GregorianCalendar *this_00;
  Locale *size;
  Locale loc;
  Locale LStack_f8;
  
  size = &LStack_f8;
  Locale::Locale(&LStack_f8);
  (*(key->super_UObject)._vptr_UObject[0xb])(key);
  this_00 = (GregorianCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)size);
  if (this_00 == (GregorianCalendar *)0x0) {
    this_00 = (GregorianCalendar *)0x0;
  }
  else {
    GregorianCalendar::GregorianCalendar(this_00,&LStack_f8,status);
  }
  Locale::~Locale(&LStack_f8);
  return (UObject *)this_00;
}

Assistant:

virtual UObject* handleDefault(const ICUServiceKey& key, UnicodeString* /*actualID*/, UErrorCode& status) const {
        LocaleKey& lkey = (LocaleKey&)key;
        //int32_t kind = lkey.kind();

        Locale loc;
        lkey.canonicalLocale(loc);

#ifdef U_DEBUG_CALSVC
        Locale loc2;
        lkey.currentLocale(loc2);
        fprintf(stderr, "CalSvc:handleDefault for currentLoc %s, canloc %s\n", (const char*)loc.getName(),  (const char*)loc2.getName());
#endif
        Calendar *nc =  new GregorianCalendar(loc, status);

#ifdef U_DEBUG_CALSVC
        UErrorCode status2 = U_ZERO_ERROR;
        fprintf(stderr, "New default calendar has tz=%d\n", ((Calendar*)nc)->get(UCAL_ZONE_OFFSET, status2));
#endif
        return nc;
    }